

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
parse_segment(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData,
             int notEmpty)

{
  size_t sVar1;
  curi_status local_44;
  curi_status status;
  size_t initialOffset;
  int notEmpty_local;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  sVar1 = *offset;
  local_44 = curi_status_success;
  if (notEmpty != 0) {
    local_44 = parse_pchar(uri,len,offset,settings,userData);
  }
  if (local_44 == curi_status_success) {
    local_44 = parse_pchars(uri,len,offset,settings,userData);
  }
  if (local_44 == curi_status_success) {
    local_44 = handle_path_segment(uri + sVar1,*offset - sVar1,settings,userData);
  }
  return local_44;
}

Assistant:

static curi_status parse_segment(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData, int notEmpty)
{
    // segment = pchars
    // segment-not-empty = pchar pchars
    const size_t initialOffset = *offset;
    curi_status status = curi_status_success;

    if (notEmpty && status == curi_status_success)
        status = parse_pchar(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_pchars(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = handle_path_segment(uri + initialOffset, *offset - initialOffset, settings, userData);

    return status;
}